

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpen(sqlite3_vfs *pVfs,Pager **ppPager,char *zFilename,int nExtra,int flags,
                    int vfsFlags,_func_void_DbPage_ptr *xReinit)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Pager *pPager_00;
  ushort in_CX;
  sqlite3_file *psVar5;
  char *pcVar6;
  char *in_RDX;
  undefined8 *in_RSI;
  sqlite3_vfs *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar7;
  int iDc;
  int fout;
  char *z;
  int nUri;
  char *zUri;
  u32 szPageDflt;
  int pcacheSize;
  int useJournal;
  int nPathname;
  char *zPathname;
  int journalFileSize;
  int readOnly;
  int memDb;
  int tempFile;
  int rc;
  Pager *pPager;
  u8 *pPtr;
  char *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  sqlite3 *in_stack_ffffffffffffff78;
  long lVar8;
  int in_stack_ffffffffffffff80;
  int nReserve;
  sqlite3 *pPageSize;
  u32 uVar9;
  int local_64;
  char *local_60;
  bool local_50;
  u8 local_48;
  int local_44;
  uint local_2c;
  ushort local_24;
  char *local_20;
  int local_4;
  
  local_44 = 0;
  local_48 = '\0';
  bVar1 = false;
  local_60 = (char *)0x0;
  local_64 = 0;
  bVar7 = (in_R8D & 1) == 0;
  iVar2 = sqlite3PcacheSize();
  uVar9 = 0x1000;
  pPageSize = (sqlite3 *)0x0;
  nReserve = 0;
  iVar3 = sqlite3JournalSize(in_RDI);
  uVar4 = iVar3 + 7U & 0xfffffff8;
  *in_RSI = 0;
  local_20 = in_RDX;
  if ((((in_R8D & 2) != 0) && (bVar1 = true, in_RDX != (char *)0x0)) && (*in_RDX != '\0')) {
    local_60 = sqlite3DbStrDup(in_stack_ffffffffffffff78,
                               (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              );
    if (local_60 == (char *)0x0) {
      return 7;
    }
    local_64 = sqlite3Strlen30(in_stack_ffffffffffffff68);
    local_20 = (char *)0x0;
  }
  if ((local_20 != (char *)0x0) && (*local_20 != '\0')) {
    local_60 = (char *)sqlite3DbMallocRaw(in_stack_ffffffffffffff78,
                                          CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70));
    if (local_60 == (char *)0x0) {
      return 7;
    }
    *local_60 = '\0';
    local_44 = sqlite3OsFullPathname
                         ((sqlite3_vfs *)CONCAT44(nReserve,in_stack_ffffffffffffff80),
                          (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                          in_stack_ffffffffffffff68);
    local_64 = sqlite3Strlen30(in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff68 = local_20;
    iVar3 = sqlite3Strlen30(local_20);
    in_stack_ffffffffffffff78 = (sqlite3 *)(in_stack_ffffffffffffff68 + (iVar3 + 1));
    pPageSize = in_stack_ffffffffffffff78;
    while (*(char *)&in_stack_ffffffffffffff78->pVfs != '\0') {
      iVar3 = sqlite3Strlen30(in_stack_ffffffffffffff68);
      lVar8 = (long)in_stack_ffffffffffffff78->aLimit + (long)(iVar3 + 1) + -0x7c;
      iVar3 = sqlite3Strlen30(in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff78 = (sqlite3 *)(lVar8 + (iVar3 + 1));
    }
    nReserve = ((int)in_stack_ffffffffffffff78 + 1) - (int)pPageSize;
    if ((local_44 == 0) && (in_RDI->mxPathname < local_64 + 8)) {
      local_44 = sqlite3CantopenError(0);
    }
    if (local_44 != 0) {
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
      return local_44;
    }
  }
  pPager_00 = (Pager *)sqlite3MallocZero(CONCAT44(in_stack_ffffffffffffff74,
                                                  in_stack_ffffffffffffff70));
  if (pPager_00 == (Pager *)0x0) {
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff68);
    return 7;
  }
  pPager_00->pPCache = (PCache *)(pPager_00 + 1);
  psVar5 = (sqlite3_file *)((long)&pPager_00[1].pVfs + (long)(int)(iVar2 + 7U & 0xfffffff8));
  pPager_00->fd = psVar5;
  psVar5 = (sqlite3_file *)
           ((long)&psVar5->pMethods + (long)(int)(in_RDI->szOsFile + 7U & 0xfffffff8));
  pPager_00->sjfd = psVar5;
  psVar5 = (sqlite3_file *)((long)&psVar5->pMethods + (long)(int)uVar4);
  pPager_00->jfd = psVar5;
  pcVar6 = (char *)((long)&psVar5->pMethods + (long)(int)uVar4);
  pPager_00->zFilename = pcVar6;
  if (local_60 != (char *)0x0) {
    pPager_00->zJournal = pcVar6 + (local_64 + 1 + nReserve);
    memcpy(pPager_00->zFilename,local_60,(long)local_64);
    if (nReserve != 0) {
      memcpy(pPager_00->zFilename + (local_64 + 1),pPageSize,(long)nReserve);
    }
    memcpy(pPager_00->zJournal,local_60,(long)local_64);
    builtin_strncpy(pPager_00->zJournal + local_64,"-journal",9);
    (pPager_00->zJournal + (long)local_64 + 8)[1] = '\0';
    pPager_00->zWal = pPager_00->zJournal + (local_64 + 9);
    memcpy(pPager_00->zWal,local_60,(long)local_64);
    builtin_strncpy(pPager_00->zWal + local_64,"-wal",5);
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff68);
  }
  pPager_00->pVfs = in_RDI;
  pPager_00->vfsFlags = in_R9D;
  local_2c = in_R9D;
  if ((local_20 == (char *)0x0) || (*local_20 == '\0')) {
LAB_00144cd9:
    iVar3 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    local_48 = '\x01';
    pPager_00->eState = '\x01';
    pPager_00->eLock = '\x04';
    pPager_00->noLock = '\x01';
    local_50 = (bool)((byte)local_2c & 1);
  }
  else {
    in_stack_ffffffffffffff74 = 0;
    local_44 = sqlite3OsOpen((sqlite3_vfs *)CONCAT44(iVar2,uVar9),(char *)pPageSize,
                             (sqlite3_file *)CONCAT44(nReserve,in_stack_ffffffffffffff80),
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                             (int *)(ulong)in_stack_ffffffffffffff70);
    local_50 = (in_stack_ffffffffffffff74 & 1) != 0;
    if (local_44 == 0) {
      in_stack_ffffffffffffff70 = sqlite3OsDeviceCharacteristics((sqlite3_file *)0x144c2f);
      if ((!local_50) && (setSectorSize((Pager *)0x144c44), uVar9 < pPager_00->sectorSize)) {
        if (pPager_00->sectorSize < 0x2001) {
          uVar9 = pPager_00->sectorSize;
        }
        else {
          uVar9 = 0x2000;
        }
      }
      iVar3 = sqlite3_uri_boolean((char *)CONCAT44(nReserve,in_stack_ffffffffffffff80),
                                  (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      pPager_00->noLock = (u8)iVar3;
      if (((in_stack_ffffffffffffff70 & 0x2000) != 0) ||
         (iVar3 = sqlite3_uri_boolean((char *)CONCAT44(nReserve,in_stack_ffffffffffffff80),
                                      (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74),
         iVar3 != 0)) {
        local_2c = in_R9D | 1;
        goto LAB_00144cd9;
      }
    }
    iVar3 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  }
  if (local_44 == 0) {
    local_44 = sqlite3PagerSetPagesize((Pager *)CONCAT44(iVar2,uVar9),(u32 *)pPageSize,nReserve);
  }
  local_24 = in_CX;
  if (local_44 == 0) {
    local_24 = in_CX + 7 & 0xfff8;
    local_44 = sqlite3PcacheOpen(nReserve,in_stack_ffffffffffffff80,iVar3,
                                 (_func_int_void_ptr_PgHdr_ptr *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 in_stack_ffffffffffffff68,(PCache *)0x144d88);
  }
  if (local_44 == 0) {
    pPager_00->useJournal = bVar7;
    pPager_00->mxPgno = 0x3fffffff;
    pPager_00->tempFile = local_48;
    pPager_00->exclusiveMode = local_48;
    pPager_00->changeCountDone = pPager_00->tempFile;
    pPager_00->memDb = bVar1;
    pPager_00->readOnly = local_50;
    pPager_00->noSync = pPager_00->tempFile;
    if (pPager_00->noSync == '\0') {
      pPager_00->fullSync = '\x01';
      pPager_00->extraSync = '\0';
      pPager_00->syncFlags = '\x02';
      pPager_00->walSyncFlags = '\n';
    }
    pPager_00->nExtra = local_24;
    pPager_00->journalSizeLimit = -1;
    setSectorSize((Pager *)0x144e9f);
    if (bVar7) {
      if (bVar1) {
        pPager_00->journalMode = '\x04';
      }
    }
    else {
      pPager_00->journalMode = '\x02';
    }
    pPager_00->xReiniter = _iDc;
    setGetterMethod(pPager_00);
    *in_RSI = pPager_00;
    local_4 = 0;
  }
  else {
    sqlite3OsClose((sqlite3_file *)0x144da1);
    sqlite3PageFree((void *)0x144db2);
    sqlite3_free((void *)0x144dbc);
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpen(
  sqlite3_vfs *pVfs,       /* The virtual file system to use */
  Pager **ppPager,         /* OUT: Return the Pager structure here */
  const char *zFilename,   /* Name of the database file to open */
  int nExtra,              /* Extra bytes append to each in-memory page */
  int flags,               /* flags controlling this file */
  int vfsFlags,            /* flags passed through to sqlite3_vfs.xOpen() */
  void (*xReinit)(DbPage*) /* Function to reinitialize pages */
){
  u8 *pPtr;
  Pager *pPager = 0;       /* Pager object to allocate and return */
  int rc = SQLITE_OK;      /* Return code */
  int tempFile = 0;        /* True for temp files (incl. in-memory files) */
  int memDb = 0;           /* True if this is an in-memory file */
#ifdef SQLITE_ENABLE_DESERIALIZE
  int memJM = 0;           /* Memory journal mode */
#else
# define memJM 0
#endif
  int readOnly = 0;        /* True if this is a read-only file */
  int journalFileSize;     /* Bytes to allocate for each journal fd */
  char *zPathname = 0;     /* Full path to database file */
  int nPathname = 0;       /* Number of bytes in zPathname */
  int useJournal = (flags & PAGER_OMIT_JOURNAL)==0; /* False to omit journal */
  int pcacheSize = sqlite3PcacheSize();       /* Bytes to allocate for PCache */
  u32 szPageDflt = SQLITE_DEFAULT_PAGE_SIZE;  /* Default page size */
  const char *zUri = 0;    /* URI args to copy */
  int nUri = 0;            /* Number of bytes of URI args at *zUri */

  /* Figure out how much space is required for each journal file-handle
  ** (there are two of them, the main journal and the sub-journal).  */
  journalFileSize = ROUND8(sqlite3JournalSize(pVfs));

  /* Set the output variable to NULL in case an error occurs. */
  *ppPager = 0;

#ifndef SQLITE_OMIT_MEMORYDB
  if( flags & PAGER_MEMORY ){
    memDb = 1;
    if( zFilename && zFilename[0] ){
      zPathname = sqlite3DbStrDup(0, zFilename);
      if( zPathname==0  ) return SQLITE_NOMEM_BKPT;
      nPathname = sqlite3Strlen30(zPathname);
      zFilename = 0;
    }
  }
#endif

  /* Compute and store the full pathname in an allocated buffer pointed
  ** to by zPathname, length nPathname. Or, if this is a temporary file,
  ** leave both nPathname and zPathname set to 0.
  */
  if( zFilename && zFilename[0] ){
    const char *z;
    nPathname = pVfs->mxPathname+1;
    zPathname = sqlite3DbMallocRaw(0, nPathname*2);
    if( zPathname==0 ){
      return SQLITE_NOMEM_BKPT;
    }
    zPathname[0] = 0; /* Make sure initialized even if FullPathname() fails */
    rc = sqlite3OsFullPathname(pVfs, zFilename, nPathname, zPathname);
    nPathname = sqlite3Strlen30(zPathname);
    z = zUri = &zFilename[sqlite3Strlen30(zFilename)+1];
    while( *z ){
      z += sqlite3Strlen30(z)+1;
      z += sqlite3Strlen30(z)+1;
    }
    nUri = (int)(&z[1] - zUri);
    assert( nUri>=0 );
    if( rc==SQLITE_OK && nPathname+8>pVfs->mxPathname ){
      /* This branch is taken when the journal path required by
      ** the database being opened will be more than pVfs->mxPathname
      ** bytes in length. This means the database cannot be opened,
      ** as it will not be possible to open the journal file or even
      ** check for a hot-journal before reading.
      */
      rc = SQLITE_CANTOPEN_BKPT;
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(0, zPathname);
      return rc;
    }
  }

  /* Allocate memory for the Pager structure, PCache object, the
  ** three file descriptors, the database file name and the journal 
  ** file name. The layout in memory is as follows:
  **
  **     Pager object                    (sizeof(Pager) bytes)
  **     PCache object                   (sqlite3PcacheSize() bytes)
  **     Database file handle            (pVfs->szOsFile bytes)
  **     Sub-journal file handle         (journalFileSize bytes)
  **     Main journal file handle        (journalFileSize bytes)
  **     Database file name              (nPathname+1 bytes)
  **     Journal file name               (nPathname+8+1 bytes)
  */
  pPtr = (u8 *)sqlite3MallocZero(
    ROUND8(sizeof(*pPager)) +      /* Pager structure */
    ROUND8(pcacheSize) +           /* PCache object */
    ROUND8(pVfs->szOsFile) +       /* The main db file */
    journalFileSize * 2 +          /* The two journal files */ 
    nPathname + 1 + nUri +         /* zFilename */
    nPathname + 8 + 2              /* zJournal */
#ifndef SQLITE_OMIT_WAL
    + nPathname + 4 + 2            /* zWal */
#endif
  );
  assert( EIGHT_BYTE_ALIGNMENT(SQLITE_INT_TO_PTR(journalFileSize)) );
  if( !pPtr ){
    sqlite3DbFree(0, zPathname);
    return SQLITE_NOMEM_BKPT;
  }
  pPager =              (Pager*)(pPtr);
  pPager->pPCache =    (PCache*)(pPtr += ROUND8(sizeof(*pPager)));
  pPager->fd =   (sqlite3_file*)(pPtr += ROUND8(pcacheSize));
  pPager->sjfd = (sqlite3_file*)(pPtr += ROUND8(pVfs->szOsFile));
  pPager->jfd =  (sqlite3_file*)(pPtr += journalFileSize);
  pPager->zFilename =    (char*)(pPtr += journalFileSize);
  assert( EIGHT_BYTE_ALIGNMENT(pPager->jfd) );

  /* Fill in the Pager.zFilename and Pager.zJournal buffers, if required. */
  if( zPathname ){
    assert( nPathname>0 );
    pPager->zJournal =   (char*)(pPtr += nPathname + 1 + nUri);
    memcpy(pPager->zFilename, zPathname, nPathname);
    if( nUri ) memcpy(&pPager->zFilename[nPathname+1], zUri, nUri);
    memcpy(pPager->zJournal, zPathname, nPathname);
    memcpy(&pPager->zJournal[nPathname], "-journal\000", 8+2);
    sqlite3FileSuffix3(pPager->zFilename, pPager->zJournal);
#ifndef SQLITE_OMIT_WAL
    pPager->zWal = &pPager->zJournal[nPathname+8+1];
    memcpy(pPager->zWal, zPathname, nPathname);
    memcpy(&pPager->zWal[nPathname], "-wal\000", 4+1);
    sqlite3FileSuffix3(pPager->zFilename, pPager->zWal);
#endif
    sqlite3DbFree(0, zPathname);
  }
  pPager->pVfs = pVfs;
  pPager->vfsFlags = vfsFlags;

  /* Open the pager file.
  */
  if( zFilename && zFilename[0] ){
    int fout = 0;                    /* VFS flags returned by xOpen() */
    rc = sqlite3OsOpen(pVfs, pPager->zFilename, pPager->fd, vfsFlags, &fout);
    assert( !memDb );
#ifdef SQLITE_ENABLE_DESERIALIZE
    memJM = (fout&SQLITE_OPEN_MEMORY)!=0;
#endif
    readOnly = (fout&SQLITE_OPEN_READONLY)!=0;

    /* If the file was successfully opened for read/write access,
    ** choose a default page size in case we have to create the
    ** database file. The default page size is the maximum of:
    **
    **    + SQLITE_DEFAULT_PAGE_SIZE,
    **    + The value returned by sqlite3OsSectorSize()
    **    + The largest page size that can be written atomically.
    */
    if( rc==SQLITE_OK ){
      int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      if( !readOnly ){
        setSectorSize(pPager);
        assert(SQLITE_DEFAULT_PAGE_SIZE<=SQLITE_MAX_DEFAULT_PAGE_SIZE);
        if( szPageDflt<pPager->sectorSize ){
          if( pPager->sectorSize>SQLITE_MAX_DEFAULT_PAGE_SIZE ){
            szPageDflt = SQLITE_MAX_DEFAULT_PAGE_SIZE;
          }else{
            szPageDflt = (u32)pPager->sectorSize;
          }
        }
#ifdef SQLITE_ENABLE_ATOMIC_WRITE
        {
          int ii;
          assert(SQLITE_IOCAP_ATOMIC512==(512>>8));
          assert(SQLITE_IOCAP_ATOMIC64K==(65536>>8));
          assert(SQLITE_MAX_DEFAULT_PAGE_SIZE<=65536);
          for(ii=szPageDflt; ii<=SQLITE_MAX_DEFAULT_PAGE_SIZE; ii=ii*2){
            if( iDc&(SQLITE_IOCAP_ATOMIC|(ii>>8)) ){
              szPageDflt = ii;
            }
          }
        }
#endif
      }
      pPager->noLock = sqlite3_uri_boolean(zFilename, "nolock", 0);
      if( (iDc & SQLITE_IOCAP_IMMUTABLE)!=0
       || sqlite3_uri_boolean(zFilename, "immutable", 0) ){
          vfsFlags |= SQLITE_OPEN_READONLY;
          goto act_like_temp_file;
      }
    }
  }else{
    /* If a temporary file is requested, it is not opened immediately.
    ** In this case we accept the default page size and delay actually
    ** opening the file until the first call to OsWrite().
    **
    ** This branch is also run for an in-memory database. An in-memory
    ** database is the same as a temp-file that is never written out to
    ** disk and uses an in-memory rollback journal.
    **
    ** This branch also runs for files marked as immutable.
    */ 
act_like_temp_file:
    tempFile = 1;
    pPager->eState = PAGER_READER;     /* Pretend we already have a lock */
    pPager->eLock = EXCLUSIVE_LOCK;    /* Pretend we are in EXCLUSIVE mode */
    pPager->noLock = 1;                /* Do no locking */
    readOnly = (vfsFlags&SQLITE_OPEN_READONLY);
  }

  /* The following call to PagerSetPagesize() serves to set the value of 
  ** Pager.pageSize and to allocate the Pager.pTmpSpace buffer.
  */
  if( rc==SQLITE_OK ){
    assert( pPager->memDb==0 );
    rc = sqlite3PagerSetPagesize(pPager, &szPageDflt, -1);
    testcase( rc!=SQLITE_OK );
  }

  /* Initialize the PCache object. */
  if( rc==SQLITE_OK ){
    nExtra = ROUND8(nExtra);
    assert( nExtra>=8 && nExtra<1000 );
    rc = sqlite3PcacheOpen(szPageDflt, nExtra, !memDb,
                       !memDb?pagerStress:0, (void *)pPager, pPager->pPCache);
  }

  /* If an error occurred above, free the  Pager structure and close the file.
  */
  if( rc!=SQLITE_OK ){
    sqlite3OsClose(pPager->fd);
    sqlite3PageFree(pPager->pTmpSpace);
    sqlite3_free(pPager);
    return rc;
  }

  PAGERTRACE(("OPEN %d %s\n", FILEHANDLEID(pPager->fd), pPager->zFilename));
  IOTRACE(("OPEN %p %s\n", pPager, pPager->zFilename))

  pPager->useJournal = (u8)useJournal;
  /* pPager->stmtOpen = 0; */
  /* pPager->stmtInUse = 0; */
  /* pPager->nRef = 0; */
  /* pPager->stmtSize = 0; */
  /* pPager->stmtJSize = 0; */
  /* pPager->nPage = 0; */
  pPager->mxPgno = SQLITE_MAX_PAGE_COUNT;
  /* pPager->state = PAGER_UNLOCK; */
  /* pPager->errMask = 0; */
  pPager->tempFile = (u8)tempFile;
  assert( tempFile==PAGER_LOCKINGMODE_NORMAL 
          || tempFile==PAGER_LOCKINGMODE_EXCLUSIVE );
  assert( PAGER_LOCKINGMODE_EXCLUSIVE==1 );
  pPager->exclusiveMode = (u8)tempFile; 
  pPager->changeCountDone = pPager->tempFile;
  pPager->memDb = (u8)memDb;
  pPager->readOnly = (u8)readOnly;
  assert( useJournal || pPager->tempFile );
  pPager->noSync = pPager->tempFile;
  if( pPager->noSync ){
    assert( pPager->fullSync==0 );
    assert( pPager->extraSync==0 );
    assert( pPager->syncFlags==0 );
    assert( pPager->walSyncFlags==0 );
  }else{
    pPager->fullSync = 1;
    pPager->extraSync = 0;
    pPager->syncFlags = SQLITE_SYNC_NORMAL;
    pPager->walSyncFlags = SQLITE_SYNC_NORMAL | (SQLITE_SYNC_NORMAL<<2);
  }
  /* pPager->pFirst = 0; */
  /* pPager->pFirstSynced = 0; */
  /* pPager->pLast = 0; */
  pPager->nExtra = (u16)nExtra;
  pPager->journalSizeLimit = SQLITE_DEFAULT_JOURNAL_SIZE_LIMIT;
  assert( isOpen(pPager->fd) || tempFile );
  setSectorSize(pPager);
  if( !useJournal ){
    pPager->journalMode = PAGER_JOURNALMODE_OFF;
  }else if( memDb || memJM ){
    pPager->journalMode = PAGER_JOURNALMODE_MEMORY;
  }
  /* pPager->xBusyHandler = 0; */
  /* pPager->pBusyHandlerArg = 0; */
  pPager->xReiniter = xReinit;
  setGetterMethod(pPager);
  /* memset(pPager->aHash, 0, sizeof(pPager->aHash)); */
  /* pPager->szMmap = SQLITE_DEFAULT_MMAP_SIZE // will be set by btree.c */

  *ppPager = pPager;
  return SQLITE_OK;
}